

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

int nn_ws_handshake_hash_key(char *key,size_t key_len,char *hashed,size_t hashed_len)

{
  int iVar1;
  size_t in_RCX;
  uint8_t *in_RDX;
  ulong in_RSI;
  nn_sha1 hash;
  uint i;
  int rc;
  uint8_t in_stack_ffffffffffffff7f;
  nn_sha1 *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffffd0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  
  nn_sha1_init((nn_sha1 *)&stack0xffffffffffffff7c);
  for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
    nn_sha1_hashbyte(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  }
  for (uVar2 = 0; uVar2 < 0x24; uVar2 = uVar2 + 1) {
    nn_sha1_hashbyte(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  }
  nn_sha1_result(in_stack_ffffffffffffff80);
  iVar1 = nn_base64_encode(in_RDX,in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffdc,uVar2),
                           in_stack_ffffffffffffffd0);
  return iVar1;
}

Assistant:

static int nn_ws_handshake_hash_key (const char *key, size_t key_len,
    char *hashed, size_t hashed_len)
{
    int rc;
    unsigned i;
    struct nn_sha1 hash;

    nn_sha1_init (&hash);

    for (i = 0; i < key_len; i++)
        nn_sha1_hashbyte (&hash, key [i]);

    for (i = 0; i < strlen (NN_WS_HANDSHAKE_MAGIC_GUID); i++)
        nn_sha1_hashbyte (&hash, NN_WS_HANDSHAKE_MAGIC_GUID [i]);

    rc = nn_base64_encode (nn_sha1_result (&hash),
        sizeof (hash.state), hashed, hashed_len);

    return rc;
}